

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O1

REF_STATUS ref_recon_normal(REF_GRID ref_grid,REF_INT node,REF_DBL *normal)

{
  double dVar1;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  REF_INT cell;
  int iVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  REF_DBL area;
  REF_DBL tri_norm [3];
  REF_INT nodes [27];
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  *normal = 0.0;
  normal[1] = 0.0;
  normal[2] = 0.0;
  cell = -1;
  uVar5 = 0xffffffff;
  if (-1 < node) {
    uVar5 = 0xffffffff;
    if (node < ref_cell->ref_adj->nnode) {
      uVar5 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node];
    }
  }
  iVar4 = (int)uVar5;
  if (iVar4 != -1) {
    cell = ref_cell->ref_adj->item[iVar4].ref;
  }
  dVar10 = 0.0;
  while( true ) {
    if (iVar4 == -1) {
      dVar6 = dVar10 * 1e+20;
      if (dVar6 <= -dVar6) {
        dVar6 = -dVar6;
      }
      dVar1 = *normal;
      dVar7 = dVar1;
      if (dVar1 <= -dVar1) {
        dVar7 = -dVar1;
      }
      if (dVar7 < dVar6) {
        dVar7 = normal[1];
        dVar8 = dVar7;
        if (dVar7 <= -dVar7) {
          dVar8 = -dVar7;
        }
        if (dVar8 < dVar6) {
          dVar8 = normal[2];
          dVar9 = dVar8;
          if (dVar8 <= -dVar8) {
            dVar9 = -dVar8;
          }
          if (dVar9 < dVar6) {
            *normal = dVar1 / dVar10;
            normal[1] = dVar7 / dVar10;
            normal[2] = dVar8 / dVar10;
            uVar3 = ref_math_normalize(normal);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x5c5,"ref_recon_normal",(ulong)uVar3,"norm");
              return uVar3;
            }
            return 0;
          }
        }
      }
      *normal = 0.0;
      normal[1] = 0.0;
      normal[2] = 0.0;
      return 4;
    }
    uVar3 = ref_cell_nodes(ref_cell,cell,local_a8);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x5b7
             ,"ref_recon_normal",(ulong)uVar3,"cell nodes");
      return uVar3;
    }
    uVar3 = ref_node_tri_normal(ref_node,local_a8,&local_c8);
    if (uVar3 != 0) break;
    uVar3 = ref_node_tri_area(ref_node,local_a8,&local_d0);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x5b9
             ,"ref_recon_normal",(ulong)uVar3,"area");
      return uVar3;
    }
    *normal = local_c8 * local_d0 + *normal;
    normal[1] = local_c0 * local_d0 + normal[1];
    normal[2] = local_b8 * local_d0 + normal[2];
    pRVar2 = ref_cell->ref_adj->item;
    iVar4 = pRVar2[(int)uVar5].next;
    uVar5 = (ulong)iVar4;
    if (uVar5 == 0xffffffffffffffff) {
      cell = -1;
    }
    else {
      cell = pRVar2[uVar5].ref;
    }
    dVar10 = dVar10 + local_d0;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x5b8,
         "ref_recon_normal",(ulong)uVar3,"cell nodes");
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_recon_normal(REF_GRID ref_grid, REF_INT node,
                                    REF_DBL *normal) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL total, area, tri_norm[3];

  normal[0] = 0.0;
  normal[1] = 0.0;
  normal[2] = 0.0;
  total = 0.0;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_node_tri_normal(ref_node, nodes, tri_norm), "cell nodes");
    RSS(ref_node_tri_area(ref_node, nodes, &area), "area");
    normal[0] += area * tri_norm[0];
    normal[1] += area * tri_norm[1];
    normal[2] += area * tri_norm[2];
    total += area;
  }
  if (ref_math_divisible(normal[0], total) &&
      ref_math_divisible(normal[1], total) &&
      ref_math_divisible(normal[2], total)) {
    normal[0] /= total;
    normal[1] /= total;
    normal[2] /= total;
    RSS(ref_math_normalize(normal), "norm");
  } else {
    normal[0] = 0.0;
    normal[1] = 0.0;
    normal[2] = 0.0;
    return REF_DIV_ZERO;
  }
  return REF_SUCCESS;
}